

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void plutovg_memfill32(uint *dest,int length,uint value)

{
  bool bVar1;
  ulong uVar2;
  uint *puVar3;
  long lVar4;
  int iVar5;
  
  if (((ulong)dest & 0xf) != 0 && length != 0) {
    puVar3 = dest + 1;
    iVar5 = length;
    do {
      *dest = value;
      dest = dest + 1;
      length = iVar5 + -1;
      if (iVar5 == 1) break;
      uVar2 = (ulong)puVar3 & 0xf;
      puVar3 = puVar3 + 1;
      iVar5 = length;
    } while (uVar2 != 0);
  }
  iVar5 = length;
  if (0x1f < length) {
    do {
      *dest = value;
      dest[1] = value;
      dest[2] = value;
      dest[3] = value;
      dest[4] = value;
      dest[5] = value;
      dest[6] = value;
      dest[7] = value;
      dest[8] = value;
      dest[9] = value;
      dest[10] = value;
      dest[0xb] = value;
      dest[0xc] = value;
      dest[0xd] = value;
      dest[0xe] = value;
      dest[0xf] = value;
      dest[0x10] = value;
      dest[0x11] = value;
      dest[0x12] = value;
      dest[0x13] = value;
      dest[0x14] = value;
      dest[0x15] = value;
      dest[0x16] = value;
      dest[0x17] = value;
      dest[0x18] = value;
      dest[0x19] = value;
      dest[0x1a] = value;
      dest[0x1b] = value;
      dest[0x1c] = value;
      dest[0x1d] = value;
      dest[0x1e] = value;
      dest[0x1f] = value;
      dest = dest + 0x20;
      length = iVar5 + -0x20;
      bVar1 = 0x3f < iVar5;
      iVar5 = length;
    } while (bVar1);
  }
  if (0xf < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest[4] = value;
    dest[5] = value;
    dest[6] = value;
    dest[7] = value;
    dest[8] = value;
    dest[9] = value;
    dest[10] = value;
    dest[0xb] = value;
    dest[0xc] = value;
    dest[0xd] = value;
    dest[0xe] = value;
    dest[0xf] = value;
    dest = dest + 0x10;
    length = length + -0x10;
  }
  if (7 < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest[4] = value;
    dest[5] = value;
    dest[6] = value;
    dest[7] = value;
    dest = dest + 8;
    length = length + -8;
  }
  if (3 < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest = dest + 4;
    length = length + -4;
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      dest[lVar4] = value;
      lVar4 = lVar4 + 1;
    } while (length != (int)lVar4);
  }
  return;
}

Assistant:

void plutovg_memfill32(unsigned int* dest, int length, unsigned int value)
{
    __m128i vector_data = _mm_set_epi32(value, value, value, value);
    while(length && ((uintptr_t)dest & 0xf)) {
        *dest++ = value;
        length--;
    }

    while(length >= 32) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);
        _mm_store_si128((__m128i*)(dest + 16), vector_data);
        _mm_store_si128((__m128i*)(dest + 20), vector_data);
        _mm_store_si128((__m128i*)(dest + 24), vector_data);
        _mm_store_si128((__m128i*)(dest + 28), vector_data);

        dest += 32;
        length -= 32;
    }

    if(length >= 16) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);

        dest += 16;
        length -= 16;
    }

    if(length >= 8) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);

        dest += 8;
        length -= 8;
    }

    if(length >= 4) {
        _mm_store_si128((__m128i*)(dest), vector_data);

        dest += 4;
        length -= 4;
    }

    while(length) {
        *dest++ = value;
        length--;
    }
}